

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O0

string * gmlc::utilities::stringOps::trim_abi_cxx11_(string_view input,string_view whitespace)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type sVar1;
  string *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_type strEnd;
  size_type strStart;
  size_type in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  string *__pos;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  bVar2._M_str = (char *)in_RDI;
  bVar2._M_len = in_stack_ffffffffffffff68;
  __pos = in_RDI;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                    (in_stack_ffffffffffffff60,bVar2,in_stack_ffffffffffffff58);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  }
  else {
    __str._M_str = (char *)in_RDI;
    __str._M_len = in_stack_ffffffffffffff68;
    std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
              (&local_18,__str,in_stack_ffffffffffffff58);
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffff80,(size_type)__pos,(size_type)in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar2._M_str,
               (basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_len,
               in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  return __pos;
}

Assistant:

std::string trim(std::string_view input, std::string_view whitespace)
    {
        const auto strStart = input.find_first_not_of(whitespace);
        if (strStart == std::string::npos) {
            return {};  // no content
        }

        const auto strEnd = input.find_last_not_of(whitespace);

        return std::string{input.substr(strStart, strEnd - strStart + 1)};
    }